

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphBuilder.cpp
# Opt level: O0

NodeSequence __thiscall
GraphBuilder::insertPthreadJoin(GraphBuilder *this,CallInst *callInstruction)

{
  Function *pFVar1;
  CallInst *in_RDI;
  JoinNode *joinNode;
  JoinNode *in_stack_00000040;
  GraphBuilder *in_stack_00000048;
  CallInst *in_stack_ffffffffffffffc8;
  JoinNode *in_stack_ffffffffffffffd8;
  NodeSequence local_10;
  
  pFVar1 = llvm::CallBase::getCalledFunction((CallBase *)in_stack_ffffffffffffffd8);
  if (pFVar1 == (Function *)0x0) {
    createNode<(NodeType)2,decltype(nullptr),llvm::CallInst_const*>
              (in_RDI,in_stack_ffffffffffffffc8);
    addNode<JoinNode>(in_stack_00000048,in_stack_00000040);
  }
  else {
    createNode<(NodeType)2,llvm::CallInst_const*>(in_RDI);
    addNode<JoinNode>(in_stack_00000048,in_stack_00000040);
  }
  std::pair<Node_*,_Node_*>::pair<JoinNode_*&,_JoinNode_*&,_true>
            (&local_10,(JoinNode **)&stack0xffffffffffffffd8,(JoinNode **)&stack0xffffffffffffffd8);
  return local_10;
}

Assistant:

GraphBuilder::NodeSequence
GraphBuilder::insertPthreadJoin(const CallInst *callInstruction) {
    JoinNode *joinNode;
    if (callInstruction->getCalledFunction()) {
        joinNode = addNode(createNode<NodeType::JOIN>(callInstruction));
    } else {
        joinNode =
                addNode(createNode<NodeType::JOIN>(nullptr, callInstruction));
    }
    return {joinNode, joinNode};
}